

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O0

bool operator==(WitnessUnknown *w1,WitnessUnknown *w2)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  
  __x = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  uVar1 = WitnessUnknown::GetWitnessVersion
                    ((WitnessUnknown *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                    );
  uVar2 = WitnessUnknown::GetWitnessVersion
                    ((WitnessUnknown *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                    );
  if (uVar1 == uVar2) {
    WitnessUnknown::GetWitnessProgram
              ((WitnessUnknown *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    WitnessUnknown::GetWitnessProgram
              ((WitnessUnknown *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    bVar3 = std::operator==(__x,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  }
  else {
    bVar3 = false;
  }
  if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == __x) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const WitnessUnknown& w1, const WitnessUnknown& w2) {
        if (w1.GetWitnessVersion() != w2.GetWitnessVersion()) return false;
        return w1.GetWitnessProgram() == w2.GetWitnessProgram();
    }